

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quasiquote_conversion.cpp
# Opt level: O2

Expression * __thiscall
skiwi::anon_unknown_26::quasiquote_conversion_visitor::cell_to_expression
          (Expression *__return_storage_ptr__,quasiquote_conversion_visitor *this,cell *c,
          bool as_list)

{
  undefined4 extraout_EDX;
  undefined4 extraout_EDX_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  vector<skiwi::token,_std::allocator<skiwi::token>_> tokens;
  Expression expr;
  stringstream str;
  vector<skiwi::token,_std::allocator<skiwi::token>_> local_2a8;
  _Variant_storage<false,_skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
  local_290;
  stringstream local_1a0 [16];
  skiwi local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  operator<<(local_190,(ostream *)this,(cell *)CONCAT44(extraout_var,extraout_EDX));
  std::__cxx11::stringbuf::str();
  tokenize(&local_2a8,(string *)&local_290);
  std::__cxx11::string::~string((string *)&local_290);
  std::
  __reverse<__gnu_cxx::__normal_iterator<skiwi::token*,std::vector<skiwi::token,std::allocator<skiwi::token>>>>
            (local_2a8.super__Vector_base<skiwi::token,_std::allocator<skiwi::token>_>._M_impl.
             super__Vector_impl_data._M_start,
             local_2a8.super__Vector_base<skiwi::token,_std::allocator<skiwi::token>_>._M_impl.
             super__Vector_impl_data._M_finish);
  make_expression((Expression *)&local_290,&local_2a8);
  if ((char)c == '\0') {
    std::__detail::__variant::
    _Move_ctor_base<false,_skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
    ::_Move_ctor_base((_Move_ctor_base<false,_skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
                       *)__return_storage_ptr__,
                      (_Move_ctor_base<false,_skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
                       *)&local_290);
  }
  else {
    make_list(__return_storage_ptr__,(quasiquote_conversion_visitor *)&local_290,
              (Expression *)CONCAT44(extraout_var_00,extraout_EDX_00));
  }
  std::__detail::__variant::
  _Variant_storage<false,_skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
  ::~_Variant_storage(&local_290);
  std::vector<skiwi::token,_std::allocator<skiwi::token>_>::~vector(&local_2a8);
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

Expression cell_to_expression(const cell& c, bool as_list)
      {
      std::stringstream str;
      str << c;
      auto tokens = tokenize(str.str());
      std::reverse(tokens.begin(), tokens.end());
      auto expr = make_expression(tokens);
      if (!as_list)
        return expr;
      return make_list(expr);
      }